

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qintc.cc
# Opt level: O0

int main(void)

{
  longlong local_f8 [5];
  int local_cc [8];
  char local_aa [2];
  longlong local_a8 [8];
  int local_64 [6];
  char local_49;
  longlong lStack_48;
  char max_sc;
  longlong min_ll;
  unsigned_long_long max_ull;
  longlong max_ll;
  char c2;
  char c1;
  unsigned_long uStack_28;
  int32_t i2;
  uint64_t ul2;
  uint64_t ul1;
  uint local_10;
  int32_t i1;
  uint32_t u1;
  
  i1 = 0;
  local_10 = 0xbb40e64d;
  ul1._4_4_ = 0xbb40e64d;
  ul2 = 0x10000000000;
  uStack_28 = 0x3039;
  max_ll._4_4_ = 0x51;
  max_ll._3_1_ = 0xf7;
  max_ll._2_1_ = 0x57;
  try_convert_real<int,int>
            ("QIntC::to_int<int32_t>(i1)",true,QIntC::to_int<int>,(int *)((long)&ul1 + 4));
  try_convert_real<unsigned_int,unsigned_int>
            ("QIntC::to_uint<uint32_t>(u1)",true,QIntC::to_uint<unsigned_int>,&local_10);
  try_convert_real<unsigned_int,int>
            ("QIntC::to_int<uint32_t>(u1)",false,QIntC::to_int<unsigned_int>,&local_10);
  try_convert_real<int,unsigned_int>
            ("QIntC::to_uint<int32_t>(i1)",false,QIntC::to_uint<int>,(int *)((long)&ul1 + 4));
  try_convert_real<unsigned_long,int>
            ("QIntC::to_int<uint64_t>(ul1)",false,QIntC::to_int<unsigned_long>,&ul2);
  try_convert_real<unsigned_long,int>
            ("QIntC::to_int<uint64_t>(ul2)",true,QIntC::to_int<unsigned_long>,
             &stack0xffffffffffffffd8);
  try_convert_real<unsigned_long,unsigned_int>
            ("QIntC::to_uint<uint64_t>(ul2)",true,QIntC::to_uint<unsigned_long>,
             &stack0xffffffffffffffd8);
  try_convert_real<unsigned_int,long_long>
            ("QIntC::to_offset<uint32_t>(u1)",true,QIntC::to_offset<unsigned_int>,&local_10);
  try_convert_real<int,long_long>
            ("QIntC::to_offset<int32_t>(i1)",true,QIntC::to_offset<int>,(int *)((long)&ul1 + 4));
  try_convert_real<int,unsigned_long_long>
            ("QIntC::to_ulonglong<int32_t>(i1)",false,QIntC::to_ulonglong<int>,
             (int *)((long)&ul1 + 4));
  try_convert_real<int,char>
            ("QIntC::to_char<int32_t>(i2)",true,QIntC::to_char<int>,(int *)((long)&max_ll + 4));
  try_convert_real<int,unsigned_char>
            ("QIntC::to_uchar<int32_t>(i2)",true,QIntC::to_uchar<int>,(int *)((long)&max_ll + 4));
  try_convert_real<signed_char,unsigned_char>
            ("QIntC::to_uchar<signed char>(c1)",false,QIntC::to_uchar<signed_char>,
             (char *)((long)&max_ll + 3));
  try_convert_real<char,unsigned_char>
            ("QIntC::to_uchar<char>(c2)",true,QIntC::to_uchar<char>,(char *)((long)&max_ll + 2));
  try_convert_real<char,char>
            ("QIntC::to_char<char>(c2)",true,QIntC::to_char<char>,(char *)((long)&max_ll + 2));
  max_ull = 0x7fffffffffffffff;
  min_ll = -1;
  lStack_48 = -0x8000000000000000;
  local_49 = '\x7f';
  local_64[5] = 1;
  local_64[4] = 2;
  try_range_check_real<int>("1 + 2",true,local_64 + 5,local_64 + 4);
  local_64[3] = 0xffffffff;
  local_64[2] = 2;
  try_range_check_real<int>("-1 + 2",true,local_64 + 3,local_64 + 2);
  local_64[1] = 0xffffff9c;
  local_64[0] = -200;
  try_range_check_real<int>("-100 + -200",true,local_64 + 1,local_64);
  local_a8[7] = 0;
  try_range_check_real<long_long>("max_ll + 0LL",true,(longlong *)&max_ull,local_a8 + 7);
  local_a8[6] = 1;
  try_range_check_real<long_long>("max_ll + 1LL",false,(longlong *)&max_ull,local_a8 + 6);
  local_a8[5] = 0;
  try_range_check_real<long_long>("max_ll + 0LL",true,(longlong *)&max_ull,local_a8 + 5);
  local_a8[4] = 1;
  try_range_check_real<long_long>("max_ll + 1LL",false,(longlong *)&max_ull,local_a8 + 4);
  local_a8[3] = 0;
  try_range_check_real<unsigned_long_long>
            ("max_ull + 0ULL",true,(unsigned_long_long *)&min_ll,
             (unsigned_long_long *)(local_a8 + 3));
  local_a8[2] = 1;
  try_range_check_real<unsigned_long_long>
            ("max_ull + 1ULL",false,(unsigned_long_long *)&min_ll,
             (unsigned_long_long *)(local_a8 + 2));
  local_a8[1] = 0;
  try_range_check_real<long_long>("min_ll + 0LL",true,&stack0xffffffffffffffb8,local_a8 + 1);
  local_a8[0] = -1;
  try_range_check_real<long_long>("min_ll + -1LL",false,&stack0xffffffffffffffb8,local_a8);
  try_range_check_real<signed_char>("max_sc + max_sc",false,&local_49,&local_49);
  local_aa[1] = 0x21;
  local_aa[0] = '#';
  try_range_check_real<char>("\'!\' + \'#\'",true,local_aa + 1,local_aa);
  local_cc[7] = 1;
  local_cc[6] = 2;
  try_range_check_subtract_real<int>("1 - 2",true,local_cc + 7,local_cc + 6);
  local_cc[5] = 0xffffffff;
  local_cc[4] = 0xfffffffe;
  try_range_check_subtract_real<int>("-1 - -2",true,local_cc + 5,local_cc + 4);
  local_cc[3] = 1;
  local_cc[2] = 10;
  try_range_check_subtract_real<int>("1 - 10",true,local_cc + 3,local_cc + 2);
  local_cc[1] = 0xffffffff;
  local_cc[0] = -10;
  try_range_check_subtract_real<int>("-1 - -10",true,local_cc + 1,local_cc);
  local_f8[4] = 0;
  try_range_check_subtract_real<long_long>
            ("0LL - min_ll",false,local_f8 + 4,&stack0xffffffffffffffb8);
  local_f8[3] = 1;
  try_range_check_subtract_real<long_long>
            ("1LL - min_ll",false,local_f8 + 3,&stack0xffffffffffffffb8);
  local_f8[2] = 0;
  try_range_check_subtract_real<long_long>("0LL - max_ll",true,local_f8 + 2,(longlong *)&max_ull);
  local_f8[1] = 0xffffffffffffffff;
  try_range_check_subtract_real<long_long>("-1LL - max_ll",true,local_f8 + 1,(longlong *)&max_ull);
  local_f8[0] = -2;
  try_range_check_subtract_real<long_long>("-2LL - max_ll",false,local_f8,(longlong *)&max_ull);
  return 0;
}

Assistant:

int
main()
{
    uint32_t u1 = 3141592653U;                  // Too big for signed type
    int32_t i1 = -1153374643;                   // Same bit pattern as u1
    uint64_t ul1 = 1099511627776LL;             // Too big for 32-bit
    uint64_t ul2 = 12345;                       // Fits into 32-bit
    int32_t i2 = 81;                            // Fits in char and uchar
    auto c1 = static_cast<signed char>('\xf7'); // Signed value when char
    char c2 = 'W';                              // char; may be signed or unsigned

    // Verify i1 and u1 have same bit pattern
    assert(static_cast<uint32_t>(i1) == u1);
    // Verify that we can unsafely convert between signed and unsigned char
    assert(c1 == static_cast<signed char>(static_cast<unsigned char>(c1)));

    try_convert(true, QIntC::to_int<int32_t>, i1);
    try_convert(true, QIntC::to_uint<uint32_t>, u1);
    try_convert(false, QIntC::to_int<uint32_t>, u1);
    try_convert(false, QIntC::to_uint<int32_t>, i1);
    try_convert(false, QIntC::to_int<uint64_t>, ul1);
    try_convert(true, QIntC::to_int<uint64_t>, ul2);
    try_convert(true, QIntC::to_uint<uint64_t>, ul2);
    try_convert(true, QIntC::to_offset<uint32_t>, u1);
    try_convert(true, QIntC::to_offset<int32_t>, i1);
    try_convert(false, QIntC::to_ulonglong<int32_t>, i1);
    try_convert(true, QIntC::to_char<int32_t>, i2);
    try_convert(true, QIntC::to_uchar<int32_t>, i2);
    try_convert(false, QIntC::to_uchar<signed char>, c1);
    try_convert(true, QIntC::to_uchar<char>, c2);
    try_convert(true, QIntC::to_char<char>, c2);

    auto constexpr max_ll = std::numeric_limits<long long>::max();
    auto constexpr max_ull = std::numeric_limits<unsigned long long>::max();
    auto constexpr min_ll = std::numeric_limits<long long>::min();
    auto constexpr max_sc = std::numeric_limits<signed char>::max();
    try_range_check(true, 1, 2);
    try_range_check(true, -1, 2);
    try_range_check(true, -100, -200);
    try_range_check(true, max_ll, 0LL);
    try_range_check(false, max_ll, 1LL);
    try_range_check(true, max_ll, 0LL);
    try_range_check(false, max_ll, 1LL);
    try_range_check(true, max_ull, 0ULL);
    try_range_check(false, max_ull, 1ULL);
    try_range_check(true, min_ll, 0LL);
    try_range_check(false, min_ll, -1LL);
    try_range_check(false, max_sc, max_sc);
    try_range_check(true, '!', '#');
    try_range_check_subtract(true, 1, 2);
    try_range_check_subtract(true, -1, -2);
    try_range_check_subtract(true, 1, 10);
    try_range_check_subtract(true, -1, -10);
    try_range_check_subtract(false, 0LL, min_ll);
    try_range_check_subtract(false, 1LL, min_ll);
    try_range_check_subtract(true, 0LL, max_ll);
    try_range_check_subtract(true, -1LL, max_ll);
    try_range_check_subtract(false, -2LL, max_ll);
    return 0;
}